

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O3

void highbd_warp_plane(WarpedMotionParams *wm,uint16_t *ref,int width,int height,int stride,
                      uint16_t *pred,int p_col,int p_row,int p_width,int p_height,int p_stride,
                      int subsampling_x,int subsampling_y,int bd,ConvolveParams *conv_params)

{
  (*av1_highbd_warp_affine)
            (wm->wmmat,ref,width,height,stride,pred,p_col,p_row,p_width,p_height,p_stride,
             subsampling_x,subsampling_y,bd,conv_params,wm->alpha,wm->beta,wm->gamma,wm->delta);
  return;
}

Assistant:

void highbd_warp_plane(WarpedMotionParams *wm, const uint16_t *const ref,
                       int width, int height, int stride, uint16_t *const pred,
                       int p_col, int p_row, int p_width, int p_height,
                       int p_stride, int subsampling_x, int subsampling_y,
                       int bd, ConvolveParams *conv_params) {
  const int32_t *const mat = wm->wmmat;
  const int16_t alpha = wm->alpha;
  const int16_t beta = wm->beta;
  const int16_t gamma = wm->gamma;
  const int16_t delta = wm->delta;

  av1_highbd_warp_affine(mat, ref, width, height, stride, pred, p_col, p_row,
                         p_width, p_height, p_stride, subsampling_x,
                         subsampling_y, bd, conv_params, alpha, beta, gamma,
                         delta);
}